

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

int __thiscall
absl::lts_20250127::Cord::CompareSlowPath
          (Cord *this,Cord *rhs,size_t compared_size,size_t size_to_compare)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  reference rVar4;
  reference rVar5;
  anon_class_1_0_00000001 advance;
  ChunkIterator rhs_it;
  ChunkIterator lhs_it;
  anon_class_1_0_00000001 local_189;
  ulong local_188;
  basic_string_view<char,_std::char_traits<char>_> local_180;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  ChunkIterator local_160;
  ChunkIterator local_c8;
  
  ChunkIterator::ChunkIterator(&local_c8,this);
  ChunkIterator::ChunkIterator(&local_160,rhs);
  if (local_c8.bytes_remaining_ == 0) {
    rVar4 = (reference)ZEXT816(0);
  }
  else {
    rVar4 = ChunkIterator::operator*(&local_c8);
  }
  if (local_160.bytes_remaining_ == 0) {
    rVar5 = (reference)ZEXT816(0);
  }
  else {
    rVar5 = ChunkIterator::operator*(&local_160);
  }
  local_170._M_len = rVar4._M_len - compared_size;
  if (compared_size <= rVar4._M_len) {
    local_180._M_len = rVar5._M_len - compared_size;
    if (rVar5._M_len < compared_size) {
      __assert_fail("compared_size <= rhs_chunk.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                    ,0x3b7,"int absl::Cord::CompareSlowPath(const Cord &, size_t, size_t) const");
    }
    local_170._M_str = rVar4._M_str + compared_size;
    local_180._M_str = rVar5._M_str + compared_size;
    uVar3 = size_to_compare - compared_size;
    local_188 = uVar3;
    while( true ) {
      bVar1 = CompareSlowPath::anon_class_1_0_00000001::operator()(&local_189,&local_c8,&local_170);
      if ((!bVar1) ||
         (bVar1 = CompareSlowPath::anon_class_1_0_00000001::operator()
                            (&local_189,&local_160,&local_180), !bVar1)) {
        return (uint)(local_180._M_len == 0) - (uint)(local_170._M_len == 0);
      }
      uVar2 = anon_unknown_70::CompareChunks(&local_170,&local_180,&local_188);
      uVar3 = uVar3 & 0xffffffff;
      if (local_188 == 0) {
        uVar3 = 0;
      }
      if (uVar2 != 0) {
        uVar3 = (ulong)uVar2;
      }
      if (uVar2 != 0) break;
      if (local_188 == 0) {
        return (int)uVar3;
      }
    }
    return (int)uVar3;
  }
  __assert_fail("compared_size <= lhs_chunk.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/cord.cc"
                ,0x3b6,"int absl::Cord::CompareSlowPath(const Cord &, size_t, size_t) const");
}

Assistant:

inline int Cord::CompareSlowPath(const Cord& rhs, size_t compared_size,
                                 size_t size_to_compare) const {
  auto advance = [](absl::Nonnull<Cord::ChunkIterator*> it,
                    absl::Nonnull<absl::string_view*> chunk) {
    if (!chunk->empty()) return true;
    ++*it;
    if (it->bytes_remaining_ == 0) return false;
    *chunk = **it;
    return true;
  };

  Cord::ChunkIterator lhs_it = chunk_begin();
  Cord::ChunkIterator rhs_it = rhs.chunk_begin();

  // compared_size is inside both first chunks.
  absl::string_view lhs_chunk =
      (lhs_it.bytes_remaining_ != 0) ? *lhs_it : absl::string_view();
  absl::string_view rhs_chunk =
      (rhs_it.bytes_remaining_ != 0) ? *rhs_it : absl::string_view();
  assert(compared_size <= lhs_chunk.size());
  assert(compared_size <= rhs_chunk.size());
  lhs_chunk.remove_prefix(compared_size);
  rhs_chunk.remove_prefix(compared_size);
  size_to_compare -= compared_size;  // skip already compared size.

  while (advance(&lhs_it, &lhs_chunk) && advance(&rhs_it, &rhs_chunk)) {
    int memcmp_res = CompareChunks(&lhs_chunk, &rhs_chunk, &size_to_compare);
    if (memcmp_res != 0) return memcmp_res;
    if (size_to_compare == 0) return 0;
  }

  return static_cast<int>(rhs_chunk.empty()) -
         static_cast<int>(lhs_chunk.empty());
}